

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

shared_ptr<Token> __thiscall Tokenizer::currentToken(Tokenizer *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<Token> sVar2;
  
  (in_RDI->value)._M_dataplus._M_p =
       (pointer)(this->token).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->token).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (in_RDI->value)._M_string_length = (size_type)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  sVar2.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar2.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Token>)sVar2.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Token> Tokenizer::currentToken() const noexcept {
  return this->token;
}